

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walHashGet(Wal *pWal,int iHash,ht_slot **paHash,u32 **paPgno,u32 *piZero)

{
  int iVar1;
  u32 *puVar2;
  ht_slot *aHash;
  u32 *puStack_40;
  u32 iZero;
  u32 *aPgno;
  u32 *puStack_30;
  int rc;
  u32 *piZero_local;
  u32 **paPgno_local;
  ht_slot **paHash_local;
  Wal *pWStack_10;
  int iHash_local;
  Wal *pWal_local;
  
  puStack_30 = piZero;
  piZero_local = (u32 *)paPgno;
  paPgno_local = (u32 **)paHash;
  paHash_local._4_4_ = iHash;
  pWStack_10 = pWal;
  iVar1 = walIndexPage(pWal,iHash,&stack0xffffffffffffffc0);
  if (iVar1 == 0) {
    puVar2 = puStack_40 + 0x1000;
    if (paHash_local._4_4_ == 0) {
      puStack_40 = puStack_40 + 0x22;
      aHash._4_4_ = 0;
    }
    else {
      aHash._4_4_ = (paHash_local._4_4_ + -1) * 0x1000 + 0xfde;
    }
    *(u32 **)piZero_local = puStack_40 + -1;
    *paPgno_local = puVar2;
    *puStack_30 = aHash._4_4_;
  }
  return iVar1;
}

Assistant:

static int walHashGet(
  Wal *pWal,                      /* WAL handle */
  int iHash,                      /* Find the iHash'th table */
  volatile ht_slot **paHash,      /* OUT: Pointer to hash index */
  volatile u32 **paPgno,          /* OUT: Pointer to page number array */
  u32 *piZero                     /* OUT: Frame associated with *paPgno[0] */
){
  int rc;                         /* Return code */
  volatile u32 *aPgno;

  rc = walIndexPage(pWal, iHash, &aPgno);
  assert( rc==SQLITE_OK || iHash>0 );

  if( rc==SQLITE_OK ){
    u32 iZero;
    volatile ht_slot *aHash;

    aHash = (volatile ht_slot *)&aPgno[HASHTABLE_NPAGE];
    if( iHash==0 ){
      aPgno = &aPgno[WALINDEX_HDR_SIZE/sizeof(u32)];
      iZero = 0;
    }else{
      iZero = HASHTABLE_NPAGE_ONE + (iHash-1)*HASHTABLE_NPAGE;
    }
  
    *paPgno = &aPgno[-1];
    *paHash = aHash;
    *piZero = iZero;
  }
  return rc;
}